

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignatureRefining.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_171::SignatureRefining::run::CodeUpdater::~CodeUpdater(CodeUpdater *this)

{
  WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>_>::~WalkerPass
            (&this->
              super_WalkerPass<wasm::PostWalker<CodeUpdater,_wasm::Visitor<CodeUpdater,_void>_>_>);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }